

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_cache.cc
# Opt level: O3

void __thiscall StorageCache::Close(StorageCache *this)

{
  _Base_ptr p_Var1;
  _Base_ptr this_00;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    this_00 = p_Var2[1]._M_left;
    if (this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      }
    }
    (**(code **)(*(long *)p_Var1 + 8))();
    if (this_00 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  return;
}

Assistant:

void StorageCache::Close() {
  for (std::pair<long long, shared_ptr<StorageClient>> element : cache_) {
    element.second->Close();
  }
}